

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Progress.cpp
# Opt level: O3

void __thiscall Progress::done(Progress *this)

{
  long lVar1;
  long lVar2;
  int iVar3;
  char local_19;
  
  iVar3 = fileno(_stdout);
  iVar3 = isatty(iVar3);
  if (iVar3 != 0) {
    if (this->remove == true) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\r",1);
      lVar1 = *(long *)(std::cout + -0x18);
      if (*(char *)(lVar1 + 0x10a1d1) == '\0') {
        std::ios::widen((char)lVar1 + -0x10);
        *(undefined1 *)(lVar1 + 0x10a1d1) = 1;
      }
      lVar2 = std::cout;
      *(undefined1 *)(lVar1 + 0x10a1d0) = 0x20;
      *(long *)(ioctl + *(long *)(lVar2 + -0x18)) = (long)this->width;
      local_19 = ' ';
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,&local_19,1);
    }
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x10);
    std::ostream::put(-0x10);
    std::ostream::flush();
  }
  return;
}

Assistant:

void Progress::done ()
{
  if (isatty (fileno (stdout)))
  {
    if (remove)
      std::cout << "\r"
                << std::setfill (' ')
                << std::setw (width)
                << ' ';

    std::cout << std::endl;
  }
}